

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

void __thiscall minibag::View::iterator::increment(iterator *this)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  pointer pVVar3;
  long lVar4;
  View *pVVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  pointer pVVar8;
  
  if (this->message_instance_ != (MessageInstance *)0x0) {
    operator_delete(this->message_instance_,0x28);
    this->message_instance_ = (MessageInstance *)0x0;
  }
  update(this->view_);
  pVVar5 = this->view_;
  if (this->view_revision_ != pVVar5->view_revision_) {
    populateSeek(this,(this->iters_).
                      super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].iter._M_node);
    pVVar5 = this->view_;
  }
  pVVar8 = (this->iters_).
           super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar5->reduce_overlap_ == true) {
    if ((this->iters_).
        super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>.
        _M_impl.super__Vector_impl_data._M_start != pVVar8) {
      p_Var1 = pVVar8[-1].iter._M_node;
      do {
        p_Var2 = pVVar8[-1].iter._M_node;
        if (p_Var2 != p_Var1) {
          return;
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        pVVar8[-1].iter._M_node = p_Var6;
        pVVar8 = (this->iters_).
                 super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pVVar8[-1].iter._M_node == ((pVVar8[-1].range)->end)._M_node) {
          pVVar8 = pVVar8 + -1;
          (this->iters_).
          super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>.
          _M_impl.super__Vector_impl_data._M_finish = pVVar8;
        }
        pVVar3 = (this->iters_).
                 super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pVVar3 == pVVar8) {
          return;
        }
        uVar7 = (long)pVVar8 - (long)pVVar3 >> 4;
        lVar4 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<minibag::ViewIterHelper*,std::vector<minibag::ViewIterHelper,std::allocator<minibag::ViewIterHelper>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<minibag::ViewIterHelperCompare>>
                  (pVVar3,pVVar8,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<minibag::ViewIterHelper*,std::vector<minibag::ViewIterHelper,std::allocator<minibag::ViewIterHelper>>>,__gnu_cxx::__ops::_Iter_comp_iter<minibag::ViewIterHelperCompare>>
                  (pVVar3,pVVar8);
        pVVar8 = (this->iters_).
                 super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while ((this->iters_).
               super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
               ._M_impl.super__Vector_impl_data._M_start != pVVar8);
    }
  }
  else {
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(pVVar8[-1].iter._M_node);
    pVVar8[-1].iter._M_node = p_Var6;
    pVVar8 = (this->iters_).
             super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pVVar8[-1].iter._M_node == ((pVVar8[-1].range)->end)._M_node) {
      pVVar8 = pVVar8 + -1;
      (this->iters_).
      super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>._M_impl.
      super__Vector_impl_data._M_finish = pVVar8;
    }
    pVVar3 = (this->iters_).
             super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pVVar3 != pVVar8) {
      uVar7 = (long)pVVar8 - (long)pVVar3 >> 4;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<minibag::ViewIterHelper*,std::vector<minibag::ViewIterHelper,std::allocator<minibag::ViewIterHelper>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<minibag::ViewIterHelperCompare>>
                (pVVar3,pVVar8,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<minibag::ViewIterHelper*,std::vector<minibag::ViewIterHelper,std::allocator<minibag::ViewIterHelper>>>,__gnu_cxx::__ops::_Iter_comp_iter<minibag::ViewIterHelperCompare>>
                (pVVar3,pVVar8);
      return;
    }
  }
  return;
}

Assistant:

void View::iterator::increment() {
    assert(view_ != NULL);

    // Our message instance is no longer valid
    if (message_instance_ != NULL)
    {
      delete message_instance_;
      message_instance_ = NULL;
    }

    view_->update();

    // Note, updating may have blown away our message-ranges and
    // replaced them in general the ViewIterHelpers are no longer
    // valid, but the iterator it stores should still be good.
    if (view_revision_ != view_->view_revision_)
        populateSeek(iters_.back().iter);

    if (view_->reduce_overlap_)
    {
        std::multiset<IndexEntry>::const_iterator last_iter = iters_.back().iter;
    
        while (!iters_.empty() && iters_.back().iter == last_iter)
        {
            iters_.back().iter++;
            if (iters_.back().iter == iters_.back().range->end)
                iters_.pop_back();
      
            std::sort(iters_.begin(), iters_.end(), ViewIterHelperCompare());
        }

    } else {

        iters_.back().iter++;
        if (iters_.back().iter == iters_.back().range->end)
            iters_.pop_back();
      
        std::sort(iters_.begin(), iters_.end(), ViewIterHelperCompare());
    }
}